

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Mesh::drag
          (Mesh *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  double w;
  double local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  double dStack_d0;
  Matrix4x4 local_a0;
  
  local_e8._0_8_ = (this->super_SceneObject).position.x;
  local_e8._8_8_ = (this->super_SceneObject).position.y;
  local_d8 = (undefined1  [8])(this->super_SceneObject).position.z;
  dStack_d0 = 1.0;
  Matrix4x4::operator*(modelViewProj,(Vector4D *)local_e8);
  local_d8 = (undefined1  [8])local_a0.entries[0].z;
  dStack_d0 = local_a0.entries[0].w;
  local_e8._0_8_ = local_a0.entries[0].x;
  local_e8._8_8_ = local_a0.entries[0].y;
  local_f0 = local_a0.entries[0].w;
  Vector4D::operator/=((Vector4D *)local_e8,&local_f0);
  dVar1 = (dy + (double)local_e8._8_8_) * local_f0;
  local_e8._8_4_ = SUB84(dVar1,0);
  local_e8._0_8_ = (dx + (double)local_e8._0_8_) * local_f0;
  local_e8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dVar1 = local_f0 * dStack_d0;
  unique0x100000a5 = SUB84(dVar1,0);
  local_d8 = (undefined1  [8])(local_f0 * (double)local_d8);
  unique0x100000a9 = (int)((ulong)dVar1 >> 0x20);
  Matrix4x4::inv(&local_a0,modelViewProj);
  Matrix4x4::operator*(&local_a0,(Vector4D *)local_e8);
  Vector4D::to3D((Vector4D *)local_e8);
  (this->super_SceneObject).position.z = local_a0.entries[0].z;
  (this->super_SceneObject).position.x = local_a0.entries[0].x;
  (this->super_SceneObject).position.y = local_a0.entries[0].y;
  return;
}

Assistant:

void Mesh::drag(double x, double y, double dx, double dy,
                const Matrix4x4 &modelViewProj) {
  Vector4D q(position, 1.);

  // Transform into clip space
  q = modelViewProj * q;
  double w = q.w;
  q /= w;

  // Shift by (dx, dy).
  q.x += dx;
  q.y += dy;

  // Transform back into model space
  q *= w;
  q = modelViewProj.inv() * q;

  position = q.to3D();
}